

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_rotate.c
# Opt level: O1

void gdImageSkewX(gdImagePtr dst,gdImagePtr src,int uRow,int iOffset,double dWeight,int clrBack,
                 int ignoretransparent)

{
  uint uVar1;
  undefined8 uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int a;
  int g;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  int b;
  int color;
  uint uVar16;
  uint local_68;
  code *local_40;
  
  if (src->trueColor == 0) {
    color = src->green[clrBack] * 0x100 + src->red[clrBack] * 0x10000 + src->blue[clrBack] +
            src->alpha[clrBack] * 0x1000000;
    local_40 = gdImageGetPixel;
  }
  else {
    local_40 = gdImageGetTrueColorPixel;
    color = clrBack;
  }
  if (iOffset < 1) {
    iVar14 = 0;
  }
  else {
    iVar6 = 0;
    do {
      gdImageSetPixel(dst,iVar6,uRow,color);
      iVar6 = iVar6 + 1;
      iVar14 = iOffset;
    } while (iOffset != iVar6);
  }
  if (iVar14 < dst->sx) {
    gdImageSetPixel(dst,iVar14,uRow,color);
  }
  if (src->sx < 1) {
    iVar14 = 0;
    local_68 = 0;
  }
  else {
    iVar14 = 0;
    do {
      uVar2 = (*local_40)(src,iVar14,uRow);
      uVar1 = (uint)uVar2;
      if (src->trueColor == 0) {
        uVar16 = src->red[(int)uVar1];
        uVar13 = src->green[(int)uVar1];
        uVar5 = src->blue[(int)uVar1];
        uVar3 = src->alpha[(int)uVar1];
      }
      else {
        uVar16 = (uint)((ulong)uVar2 >> 0x10) & 0xff;
        uVar13 = (uint)(byte)((ulong)uVar2 >> 8);
        uVar5 = uVar1 & 0xff;
        uVar3 = (uint)((ulong)uVar2 >> 0x18) & 0x7f;
      }
      local_68 = gdImageColorAllocateAlpha
                           (src,(int)((double)(int)uVar16 * dWeight),
                            (int)((double)(int)uVar13 * dWeight),(int)((double)(int)uVar5 * dWeight)
                            ,(int)((double)(int)uVar3 * dWeight));
      if (local_68 == 0xffffffff) {
        local_68 = gdImageColorClosestAlpha
                             (src,(int)((double)(int)uVar16 * dWeight),
                              (int)((double)(int)uVar13 * dWeight),
                              (int)((double)(int)uVar5 * dWeight),
                              (int)((double)(int)uVar3 * dWeight));
      }
      if (src->trueColor == 0) {
        uVar16 = src->red[(int)uVar1];
        uVar13 = src->red[(int)local_68];
        uVar5 = src->red[clrBack];
        uVar3 = src->green[(int)uVar1];
        uVar8 = src->green[(int)local_68];
        uVar9 = src->green[clrBack];
        uVar15 = src->blue[(int)uVar1];
        uVar10 = src->blue[(int)local_68];
        uVar11 = src->blue[clrBack];
        uVar7 = src->alpha[(int)uVar1];
        uVar12 = src->alpha[(int)local_68];
        uVar4 = src->alpha[clrBack];
      }
      else {
        uVar16 = uVar1 >> 0x10 & 0xff;
        uVar13 = local_68 >> 0x10 & 0xff;
        uVar5 = (uint)clrBack >> 0x10 & 0xff;
        uVar3 = uVar1 >> 8 & 0xff;
        uVar8 = local_68 >> 8 & 0xff;
        uVar9 = (uint)clrBack >> 8 & 0xff;
        uVar15 = uVar1 & 0xff;
        uVar10 = local_68 & 0xff;
        uVar11 = clrBack & 0xff;
        uVar7 = uVar1 >> 0x18 & 0x7f;
        uVar12 = local_68 >> 0x18 & 0x7f;
        uVar4 = (uint)clrBack >> 0x18 & 0x7f;
      }
      iVar6 = (uVar16 - uVar13) + uVar5;
      if (0xfe < iVar6) {
        iVar6 = 0xff;
      }
      g = (uVar3 - uVar8) + uVar9;
      if (0xfe < g) {
        g = 0xff;
      }
      b = (uVar15 - uVar10) + uVar11;
      if (0xfe < b) {
        b = 0xff;
      }
      a = (uVar7 - uVar12) + uVar4;
      if (0x7e < a) {
        a = 0x7f;
      }
      if (((ignoretransparent == 0) || (uVar16 = dst->transparent, uVar1 != uVar16)) &&
         (uVar16 = gdImageColorAllocateAlpha(dst,iVar6,g,b,a), uVar16 == 0xffffffff)) {
        uVar16 = gdImageColorClosestAlpha(dst,iVar6,g,b,a);
      }
      iVar6 = iOffset + iVar14;
      if ((-1 < iVar6) && (iVar6 < dst->sx)) {
        gdImageSetPixel(dst,iVar6,uRow,uVar16);
      }
      iVar14 = iVar14 + 1;
      clrBack = local_68;
    } while (iVar14 < src->sx);
  }
  iVar14 = iVar14 + iOffset;
  if (iVar14 < dst->sx) {
    gdImageSetPixel(dst,iVar14,uRow,local_68);
  }
  gdImageSetPixel(dst,iOffset,uRow,color);
  for (; iVar14 < dst->sx; iVar14 = iVar14 + 1) {
    gdImageSetPixel(dst,iVar14,uRow,color);
  }
  return;
}

Assistant:

void gdImageSkewX (gdImagePtr dst, gdImagePtr src, int uRow, int iOffset, double dWeight, int clrBack, int ignoretransparent)
{
	int i, r, g, b, a, clrBackR, clrBackG, clrBackB, clrBackA;
	FuncPtr f;

	int pxlOldLeft, pxlLeft=0, pxlSrc;

	/* Keep clrBack as color index if required */
	if (src->trueColor) {
		pxlOldLeft = clrBack;
		f = gdImageGetTrueColorPixel;
	} else {
		pxlOldLeft = clrBack;
		clrBackR = gdImageRed(src, clrBack);
		clrBackG = gdImageGreen(src, clrBack);
		clrBackB = gdImageBlue(src, clrBack);
		clrBackA = gdImageAlpha(src, clrBack);
		clrBack =  gdTrueColorAlpha(clrBackR, clrBackG, clrBackB, clrBackA);
		f = gdImageGetPixel;
	}

	for (i = 0; i < iOffset; i++) {
		gdImageSetPixel (dst, i, uRow, clrBack);
	}

	if (i < dst->sx) {
		gdImageSetPixel (dst, i, uRow, clrBack);
	}

	for (i = 0; i < src->sx; i++) {
		pxlSrc = f (src,i,uRow);

		r = (int)(gdImageRed(src,pxlSrc) * dWeight);
		g = (int)(gdImageGreen(src,pxlSrc) * dWeight);
		b = (int)(gdImageBlue(src,pxlSrc) * dWeight);
		a = (int)(gdImageAlpha(src,pxlSrc) * dWeight);

		pxlLeft = gdImageColorAllocateAlpha(src, r, g, b, a);

		if (pxlLeft == -1) {
			pxlLeft = gdImageColorClosestAlpha(src, r, g, b, a);
		}

		r = gdImageRed(src,pxlSrc) - (gdImageRed(src,pxlLeft) - gdImageRed(src,pxlOldLeft));
		g = gdImageGreen(src,pxlSrc) - (gdImageGreen(src,pxlLeft) - gdImageGreen(src,pxlOldLeft));
		b = gdImageBlue(src,pxlSrc) - (gdImageBlue(src,pxlLeft) - gdImageBlue(src,pxlOldLeft));
		a = gdImageAlpha(src,pxlSrc) - (gdImageAlpha(src,pxlLeft) - gdImageAlpha(src,pxlOldLeft));

		if (r>255) {
			r = 255;
		}

		if (g>255) {
			g = 255;
		}

		if (b>255) {
			b = 255;
		}

		if (a>127) {
			a = 127;
		}

		if (ignoretransparent && pxlSrc == dst->transparent) {
			pxlSrc = dst->transparent;
		} else {
			pxlSrc = gdImageColorAllocateAlpha(dst, r, g, b, a);

			if (pxlSrc == -1) {
				pxlSrc = gdImageColorClosestAlpha(dst, r, g, b, a);
			}
		}

		if ((i + iOffset >= 0) && (i + iOffset < dst->sx)) {
			gdImageSetPixel (dst, i+iOffset, uRow,  pxlSrc);
		}

		pxlOldLeft = pxlLeft;
	}

	i += iOffset;

	if (i < dst->sx) {
		gdImageSetPixel (dst, i, uRow, pxlLeft);
	}

	gdImageSetPixel (dst, iOffset, uRow, clrBack);

	i--;

	while (++i < dst->sx) {
		gdImageSetPixel (dst, i, uRow, clrBack);
	}
}